

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_fuzz.c
# Opt level: O0

int fuzzCallback(void *inputBuffer,void *outputBuffer,unsigned_long framesPerBuffer,
                PaStreamCallbackTimeInfo *timeInfo,PaStreamCallbackFlags statusFlags,void *userData)

{
  SAMPLE *pSVar1;
  float *pfVar2;
  float *pfVar3;
  float fVar4;
  uint local_4c;
  float *pfStack_48;
  uint i;
  SAMPLE *in;
  SAMPLE *out;
  void *userData_local;
  PaStreamCallbackFlags statusFlags_local;
  PaStreamCallbackTimeInfo *timeInfo_local;
  unsigned_long framesPerBuffer_local;
  void *outputBuffer_local;
  void *inputBuffer_local;
  
  in = (SAMPLE *)outputBuffer;
  if (inputBuffer == (void *)0x0) {
    for (local_4c = 0; local_4c < framesPerBuffer; local_4c = local_4c + 1) {
      pSVar1 = in + 1;
      *in = 0.0;
      in = in + 2;
      *pSVar1 = 0.0;
    }
    gNumNoInputs = gNumNoInputs + 1;
  }
  else {
    pfStack_48 = (float *)inputBuffer;
    for (local_4c = 0; local_4c < framesPerBuffer; local_4c = local_4c + 1) {
      pfVar2 = pfStack_48 + 1;
      fVar4 = CubicAmplifier(*pfStack_48);
      fVar4 = CubicAmplifier(fVar4);
      fVar4 = CubicAmplifier(fVar4);
      fVar4 = CubicAmplifier(fVar4);
      pfVar3 = in + 1;
      *in = fVar4;
      pfStack_48 = pfStack_48 + 2;
      in = in + 2;
      *pfVar3 = *pfVar2;
    }
  }
  return 0;
}

Assistant:

static int fuzzCallback( const void *inputBuffer, void *outputBuffer,
                         unsigned long framesPerBuffer,
                         const PaStreamCallbackTimeInfo* timeInfo,
                         PaStreamCallbackFlags statusFlags,
                         void *userData )
{
    SAMPLE *out = (SAMPLE*)outputBuffer;
    const SAMPLE *in = (const SAMPLE*)inputBuffer;
    unsigned int i;
    (void) timeInfo; /* Prevent unused variable warnings. */
    (void) statusFlags;
    (void) userData;

    if( inputBuffer == NULL )
    {
        for( i=0; i<framesPerBuffer; i++ )
        {
            *out++ = 0;  /* left - silent */
            *out++ = 0;  /* right - silent */
        }
        gNumNoInputs += 1;
    }
    else
    {
        for( i=0; i<framesPerBuffer; i++ )
        {
            *out++ = FUZZ(*in++);  /* left - distorted */
            *out++ = *in++;          /* right - clean */
        }
    }
    
    return paContinue;
}